

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::rotate_copy(void)

{
  basic_iterator<int> __middle;
  iterator_type *piVar1;
  initializer_list<int> input;
  initializer_list<int> __l;
  iterator iVar2;
  iterator __last;
  allocator_type local_d1;
  iterator local_d0;
  vector<int,_std::allocator<int>_> expect;
  int local_a8 [4];
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> copy;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  copy.member.data = (pointer)0x160000000b;
  copy.member.cap = 0x2c00000021;
  copy.member.size = CONCAT44(copy.member.size._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&copy;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  copy.member.data = copy_array;
  copy.member.cap = 4;
  copy.member.size = 0;
  copy.member.next = 4;
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                     ((basic_iterator<int> *)&expect);
  __middle.parent = piVar1->parent;
  __middle.current = piVar1->current;
  __last = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  std::
  rotate_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
            (iVar2,__middle,__last,&copy);
  local_a8[0] = 0x21;
  local_a8[1] = 0x2c;
  local_a8[2] = 0x37;
  local_a8[3] = 0x16;
  __l._M_len = 4;
  __l._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_d1);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&copy);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::end(&copy);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xba,"void copy_suite::rotate_copy()",iVar2,local_d0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void rotate_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::rotate_copy(span.begin(), ++span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55, 22 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}